

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O2

ssize_t __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::RpcRequest::send
          (RpcRequest *this,int __fd,void *__buf,size_t __n,int __flags)

{
  ushort uVar1;
  RpcConnectionState *pRVar2;
  RpcClient *pRVar3;
  void *pvVar4;
  undefined8 uVar5;
  PointerReader other;
  undefined8 uVar6;
  PipelineHook *pPVar7;
  byte bVar8;
  uint uVar9;
  size_t __n_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  RpcRequest *this_00;
  int __flags_00;
  undefined1 *puVar10;
  anon_union_400_1_a8a2e026_for_OneOf<capnp::_::RpcSystemBase::RpcConnectionState::Connected,_kj::Exception>_2
  *other_00;
  MessageSize MVar11;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_c__:2436:13),_kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse>_>
  appPromise;
  Own<capnp::PipelineHook,_std::nullptr_t> pipeline;
  Request<capnp::AnyPointer,_capnp::AnyPointer> replacement;
  SendInternalResult sendResult;
  undefined1 local_468 [16];
  Own<capnp::PipelineHook,_std::nullptr_t> local_458;
  undefined1 local_440 [8];
  Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcPipeline,_std::nullptr_t> local_438;
  char *local_428;
  Event *pEStack_420;
  Event **local_418;
  bool local_410 [8];
  ExceptionOrValue *local_408;
  uint local_400;
  undefined1 local_3f8 [128];
  undefined1 local_378 [400];
  Builder local_1e8;
  undefined1 local_1c0 [16];
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_1b0 [48];
  
  this_00 = (RpcRequest *)CONCAT44(in_register_00000034,__fd);
  pRVar2 = (this_00->connectionState).ptr;
  if ((pRVar2->connection).tag != 1) {
    other_00 = &(pRVar2->connection).field_1;
    kj::Exception::Exception((Exception *)local_378,(Exception *)other_00);
    kj::Promise<capnp::Response<capnp::AnyPointer>_>::Promise
              ((Promise<capnp::Response<capnp::AnyPointer>_> *)local_468,(Exception *)local_378);
    kj::Exception::Exception((Exception *)local_1c0,(Exception *)other_00);
    newBrokenPipeline((capnp *)(local_468 + 0x10),(Exception *)local_1c0);
    pPVar7 = local_458.ptr;
    uVar6 = local_468._0_8_;
    local_458.ptr = (PipelineHook *)0x0;
    local_3f8._0_8_ = local_458.disposer;
    local_3f8._32_8_ = (ForkBranchBase *)0x0;
    local_468._0_8_ = (PromiseNode *)0x0;
    (this->super_RequestHook)._vptr_RequestHook = (_func_int **)uVar6;
    local_3f8._8_8_ = (ClientHook *)0x0;
    (this->super_RequestHook).brand = local_458.disposer;
    (this->connectionState).disposer = (Disposer *)pPVar7;
    (this->connectionState).ptr = (RpcConnectionState *)0x0;
    (this->target).disposer = (Disposer *)0x0;
    (this->target).ptr = (RpcClient *)0x0;
    local_3f8._16_8_ = (PipelineOp *)0x0;
    local_3f8._24_8_ = (ExceptionOrValue *)0x0;
    AnyPointer::Pipeline::~Pipeline((Pipeline *)local_3f8);
    kj::Own<capnp::PipelineHook,_std::nullptr_t>::dispose
              ((Own<capnp::PipelineHook,_std::nullptr_t> *)(local_468 + 0x10));
    kj::Exception::~Exception((Exception *)local_1c0);
    kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_468);
    kj::Exception::~Exception((Exception *)local_378);
    return (ssize_t)this;
  }
  pRVar3 = (this_00->target).ptr;
  rpc::Call::Builder::getTarget(&local_1e8,&this_00->callBuilder);
  (*(pRVar3->super_ClientHook)._vptr_ClientHook[10])
            ((Own<capnp::ClientHook,_std::nullptr_t> *)local_378,pRVar3);
  local_3f8._0_8_ = local_378._0_8_;
  local_3f8._8_8_ = local_378._8_8_;
  local_378._8_8_ = (ClientHook *)0x0;
  kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
            ((Own<capnp::ClientHook,_std::nullptr_t> *)local_378);
  uVar6 = local_3f8._8_8_;
  if ((ClientHook *)local_3f8._8_8_ == (ClientHook *)0x0) {
    bVar8 = *(byte *)((long)(this_00->callBuilder)._builder.data + 0x10);
    sendInternal((SendInternalResult *)local_1c0,this_00,false);
    local_458.disposer = (Disposer *)0x0;
    local_458.ptr = (PipelineHook *)0x0;
    if ((bVar8 & 2) == 0) {
      local_428 = 
      "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
      ;
      pEStack_420 = (Event *)&DAT_004a5b74;
      local_418 = (Event **)0x200000097a;
      kj::
      Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>::
      fork((Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>
            *)local_378);
      pRVar2 = (this_00->connectionState).ptr;
      kj::_::
      ForkHub<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>::
      addBranch((ForkHub<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>
                 *)local_440);
      kj::
      refcounted<capnp::_::RpcSystemBase::RpcConnectionState::RpcPipeline,capnp::_::RpcSystemBase::RpcConnectionState&,kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,decltype(nullptr)>,kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,decltype(nullptr)>>>
                ((kj *)(local_440 + 8),pRVar2,
                 (Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t> *)
                 local_1c0,
                 (Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>
                  *)local_440);
      local_468._0_8_ = local_438.disposer;
      local_468._8_8_ = local_438.ptr;
      local_438.ptr = (RpcPipeline *)0x0;
      kj::Own<capnp::PipelineHook,_std::nullptr_t>::operator=
                ((Own<capnp::PipelineHook,_std::nullptr_t> *)(local_468 + 0x10),
                 (Own<capnp::PipelineHook,_std::nullptr_t> *)local_468);
      kj::Own<capnp::PipelineHook,_std::nullptr_t>::dispose
                ((Own<capnp::PipelineHook,_std::nullptr_t> *)local_468);
      kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcPipeline,_std::nullptr_t>::dispose
                ((Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcPipeline,_std::nullptr_t> *)
                 (local_440 + 8));
      kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_440);
      kj::_::
      ForkHub<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>::
      addBranch((ForkHub<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>
                 *)local_468);
      kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator=
                (local_1b0,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_468);
      kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_468);
      kj::
      Own<kj::_::ForkHub<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>,_std::nullptr_t>
      ::dispose((Own<kj::_::ForkHub<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>,_std::nullptr_t>
                 *)local_378);
    }
    else {
      getDisabledPipeline();
      kj::Own<capnp::PipelineHook,_std::nullptr_t>::operator=
                ((Own<capnp::PipelineHook,_std::nullptr_t> *)(local_468 + 0x10),
                 (Own<capnp::PipelineHook,_std::nullptr_t> *)local_378);
      kj::Own<capnp::PipelineHook,_std::nullptr_t>::dispose
                ((Own<capnp::PipelineHook,_std::nullptr_t> *)local_378);
    }
    kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,decltype(nullptr)>>
    ::
    then<capnp::_::RpcSystemBase::RpcConnectionState::RpcRequest::send()::_lambda(kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,decltype(nullptr)>&&)_1_>
              ((Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,decltype(nullptr)>>
                *)local_468,(anon_class_1_0_00000001_for_func *)local_1b0);
    pPVar7 = local_458.ptr;
    uVar6 = local_468._0_8_;
    local_458.ptr = (PipelineHook *)0x0;
    local_378._0_8_ = local_458.disposer;
    local_378._32_8_ = (void *)0x0;
    local_468._0_8_ = (PromiseNode *)0x0;
    (this->super_RequestHook)._vptr_RequestHook = (_func_int **)uVar6;
    local_378._8_8_ = (ClientHook *)0x0;
    (this->super_RequestHook).brand = local_458.disposer;
    (this->connectionState).disposer = (Disposer *)pPVar7;
    (this->connectionState).ptr = (RpcConnectionState *)0x0;
    (this->target).disposer = (Disposer *)0x0;
    (this->target).ptr = (RpcClient *)0x0;
    local_378._16_8_ = (ArrayDisposer *)0x0;
    local_378._24_8_ = (ArrayDisposer *)0x0;
    AnyPointer::Pipeline::~Pipeline((Pipeline *)local_378);
    kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_468);
    kj::Own<capnp::PipelineHook,_std::nullptr_t>::dispose
              ((Own<capnp::PipelineHook,_std::nullptr_t> *)(local_468 + 0x10));
    SendInternalResult::~SendInternalResult((SendInternalResult *)local_1c0);
    goto LAB_002bd15c;
  }
  pvVar4 = (this_00->callBuilder)._builder.data;
  uVar5 = *(undefined8 *)((long)pvVar4 + 8);
  uVar1 = *(ushort *)((long)pvVar4 + 4);
  MVar11 = AnyPointer::Builder::targetSize(&this_00->paramsBuilder);
  local_408 = (ExceptionOrValue *)MVar11.wordCount;
  local_410[0] = true;
  local_400 = MVar11.capCount;
  StructBuilder::asReader(&(this_00->callBuilder)._builder);
  if ((uint)local_3f8._112_4_ < 0x82) {
    bVar8 = 0;
LAB_002bd021:
    uVar9 = 0;
  }
  else {
    bVar8 = *(byte *)(local_3f8._96_8_ + 0x10) >> 1 & 1;
    if (local_3f8._112_4_ == 0x82) goto LAB_002bd021;
    uVar9 = (*(byte *)(local_3f8._96_8_ + 0x10) & 4) << 6;
  }
  __n_00 = (size_t)uVar1;
  puVar10 = local_440 + 0x30;
  (***(_func_int ***)uVar6)
            (local_378,uVar6,uVar5,__n_00,puVar10,(ulong)(uVar9 | bVar8),
             local_1e8._builder.segment._0_4_,local_1e8._builder.capTable._0_4_,
             local_1e8._builder.data._0_4_,local_1e8._builder.pointers._0_4_,
             local_1e8._builder._32_8_);
  __flags_00 = (int)puVar10;
  PointerBuilder::asReader(&(this_00->paramsBuilder).builder);
  other.capTable._0_4_ = (int)local_3f8._56_8_;
  other.segment = (SegmentReader *)local_3f8._48_8_;
  other.capTable._4_4_ = SUB84(local_3f8._56_8_,4);
  other.pointer._0_4_ = (int)local_3f8._64_8_;
  other.pointer._4_4_ = SUB84(local_3f8._64_8_,4);
  other.nestingLimit = (int)local_3f8._72_8_;
  other._28_4_ = SUB84(local_3f8._72_8_,4);
  PointerBuilder::copyFrom((PointerBuilder *)local_378,other,false);
  Request<capnp::AnyPointer,_capnp::AnyPointer>::send
            ((Request<capnp::AnyPointer,_capnp::AnyPointer> *)this,(int)local_378,__buf_00,__n_00,
             __flags_00);
  kj::Own<capnp::RequestHook,_std::nullptr_t>::dispose
            ((Own<capnp::RequestHook,_std::nullptr_t> *)(local_378 + 0x18));
LAB_002bd15c:
  kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
            ((Own<capnp::ClientHook,_std::nullptr_t> *)local_3f8);
  return (ssize_t)this;
}

Assistant:

RemotePromise<AnyPointer> send() override {
      if (!connectionState->connection.is<Connected>()) {
        // Connection is broken.
        // TODO(bug): Seems like we should check for redirect before this?
        const kj::Exception& e = connectionState->connection.get<Disconnected>();
        return RemotePromise<AnyPointer>(
            kj::Promise<Response<AnyPointer>>(kj::cp(e)),
            AnyPointer::Pipeline(newBrokenPipeline(kj::cp(e))));
      }

      KJ_IF_SOME(redirect, target->writeTarget(callBuilder.getTarget())) {
        // Whoops, this capability has been redirected while we were building the request!
        // We'll have to make a new request and do a copy.  Ick.

        auto replacement = redirect->newCall(
            callBuilder.getInterfaceId(), callBuilder.getMethodId(), paramsBuilder.targetSize(),
            callHintsFromReader(callBuilder));
        replacement.set(paramsBuilder);
        return replacement.send();
      } else {
        bool noPromisePipelining = callBuilder.getNoPromisePipelining();

        auto sendResult = sendInternal(false);

        kj::Own<PipelineHook> pipeline;
        if (noPromisePipelining) {
          pipeline = getDisabledPipeline();
        } else {
          auto forkedPromise = sendResult.promise.fork();

          // The pipeline must get notified of resolution before the app does to maintain ordering.
          pipeline = kj::refcounted<RpcPipeline>(
              *connectionState, kj::mv(sendResult.questionRef), forkedPromise.addBranch());

          sendResult.promise = forkedPromise.addBranch();
        }

        auto appPromise = sendResult.promise.then(
            [=](kj::Own<RpcResponse>&& response) {
              auto reader = response->getResults();
              return Response<AnyPointer>(reader, kj::mv(response));
            });

        return RemotePromise<AnyPointer>(
            kj::mv(appPromise),
            AnyPointer::Pipeline(kj::mv(pipeline)));
      }